

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHPrivateKey.cpp
# Opt level: O0

bool __thiscall DHPrivateKey::deserialise(DHPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  long *in_RDI;
  ByteString dX;
  ByteString dG;
  ByteString dP;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_a0 [56];
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  sVar1 = ByteString::size((ByteString *)0x14dd1e);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x14dd3a);
    if (sVar1 != 0) {
      sVar1 = ByteString::size((ByteString *)0x14dd56);
      if (sVar1 != 0) {
        (**(code **)(*in_RDI + 0x48))(in_RDI,local_40);
        (**(code **)(*in_RDI + 0x50))(in_RDI,local_68);
        (**(code **)(*in_RDI + 0x40))(in_RDI,local_a0);
        local_1 = 1;
        goto LAB_0014de10;
      }
    }
  }
  local_1 = 0;
LAB_0014de10:
  ByteString::~ByteString((ByteString *)0x14de1a);
  ByteString::~ByteString((ByteString *)0x14de24);
  ByteString::~ByteString((ByteString *)0x14de31);
  return (bool)(local_1 & 1);
}

Assistant:

bool DHPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dX = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dG.size() == 0) ||
	    (dX.size() == 0))
	{
		return false;
	}

	setP(dP);
	setG(dG);
	setX(dX);

	return true;
}